

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_byte.hpp
# Opt level: O1

ans_byte_encode *
ans_byte_encode::create(ans_byte_encode *__return_storage_ptr__,uint8_t *in_u8,size_t n)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  size_t sVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  array<unsigned_long,_256UL> freqs;
  array<unsigned_long,_256UL> aStack_818;
  
  memset(__return_storage_ptr__,0,0x1200);
  memset(&aStack_818,0,0x800);
  if (n != 0) {
    sVar3 = 0;
    do {
      aStack_818._M_elems[in_u8[sVar3]] = aStack_818._M_elems[in_u8[sVar3]] + 1;
      sVar3 = sVar3 + 1;
    } while (n != sVar3);
  }
  adjust_freqs(&__return_storage_ptr__->nfreqs,&aStack_818);
  auVar9 = ZEXT1664((undefined1  [16])0x0);
  lVar4 = 0;
  do {
    auVar8 = vpmovzxwd_avx512f(*(undefined1 (*) [32])
                                ((__return_storage_ptr__->nfreqs)._M_elems + lVar4));
    auVar9 = vpaddd_avx512f(auVar9,auVar8);
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x100);
  auVar7 = vextracti64x4_avx512f(auVar9,1);
  auVar9 = vpaddd_avx512f(auVar9,ZEXT3264(auVar7));
  auVar1 = vpaddd_avx(auVar9._0_16_,auVar9._16_16_);
  auVar2 = vpshufd_avx(auVar1,0xee);
  auVar1 = vpaddd_avx(auVar1,auVar2);
  auVar2 = vpshufd_avx(auVar1,0x55);
  auVar1 = vpaddd_avx(auVar1,auVar2);
  __return_storage_ptr__->frame_size = (ulong)auVar1._0_4_;
  lVar4 = 0x41;
  lVar5 = 0;
  do {
    (__return_storage_ptr__->nfreqs)._M_elems[lVar4 * 4 + -4] =
         *(unsigned_short *)((long)(__return_storage_ptr__->nfreqs)._M_elems + lVar4 + -0x41);
    (__return_storage_ptr__->nfreqs)._M_elems[lVar4 * 4 + -3] = (unsigned_short)lVar5;
    uVar6 = (ulong)*(ushort *)((long)(__return_storage_ptr__->nfreqs)._M_elems + lVar4 + -0x41);
    lVar5 = lVar5 + uVar6;
    *(ulong *)((__return_storage_ptr__->nfreqs)._M_elems + lVar4 * 4) = uVar6 << 0x24;
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0x241);
  __return_storage_ptr__->lower_bound = (ulong)auVar1._0_4_ << 4;
  return __return_storage_ptr__;
}

Assistant:

static ans_byte_encode create(const uint8_t* in_u8, size_t n)
    {
        ans_byte_encode model;
        std::array<uint64_t, constants::MAX_SIGMA> freqs { 0 };
        for (size_t i = 0; i < n; i++) {
            freqs[in_u8[i]]++;
        }
        model.nfreqs = adjust_freqs(freqs);
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        uint64_t cur_base = 0;
        uint64_t tmp = constants::K * constants::RADIX;
        for (size_t sym = 0; sym < constants::MAX_SIGMA; sym++) {
            model.table[sym].freq = model.nfreqs[sym];
            model.table[sym].base = cur_base;
            model.table[sym].sym_upper_bound = tmp * model.nfreqs[sym];
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }